

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZNLMultGridAnalysis.cpp
# Opt level: O2

void __thiscall
TPZNonLinMultGridAnalysis::OneGridAlgorithm(TPZNonLinMultGridAnalysis *this,ostream *out,int nummat)

{
  TPZCompMesh *coarcmesh;
  TPZCompMesh *this_00;
  TPZMaterial *mat;
  long lVar1;
  allocator<char> local_6e1;
  TPZAutoPointer<TPZMatrix<double>_> local_6e0;
  int marcha;
  int iter;
  int levelnumbertorefine;
  string solout;
  TPZStepSolver<double> finesolver;
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> finestiff;
  TPZLinearAnalysis finean;
  
  std::operator<<((ostream *)&std::cout,
                  "TPZNonLinMultGridAnalysis::OneGridAlgorithm Name of the out dx OneGridAlgorithm.dx\n"
                 );
  levelnumbertorefine = 1;
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_2092301);
  std::istream::operator>>((istream *)&std::cin,&levelnumbertorefine);
  coarcmesh = *(this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.
               fStore;
  this_00 = UniformlyRefineMesh(coarcmesh,levelnumbertorefine,-1);
  mat = TPZCompMesh::FindMaterial(this_00,nummat);
  this_00->fDimModel = coarcmesh->fDimModel;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&finean,"\n\t\t\t* * * MALHA COMPUTACIONAL FINA * * *\n\n",
             (allocator<char> *)&finesolver);
  TPZCompMesh::SetName(this_00,(string *)&finean);
  std::__cxx11::string::~string((string *)&finean);
  TPZGeoMesh::ResetReference(this_00->fReference);
  TPZCompMesh::LoadReferences(this_00);
  TPZLinearAnalysis::TPZLinearAnalysis(&finean,this_00,true,(ostream *)&std::cout);
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZStructMatrix(&finestiff,this_00);
  TPZAnalysis::SetStructuralMatrix(&finean.super_TPZAnalysis,(TPZStructMatrix *)&finestiff);
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer(&local_6e0,(TPZMatrix<double> *)0x0);
  TPZStepSolver<double>::TPZStepSolver(&finesolver,&local_6e0);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_6e0);
  TPZStepSolver<double>::SetDirect(&finesolver,ELDLt);
  TPZLinearAnalysis::SetSolver(&finean,(TPZSolver *)&finesolver);
  if (finean.super_TPZAnalysis.fSolution.fBaseMatrix != (TPZBaseMatrix *)0x0) {
    (*((finean.super_TPZAnalysis.fSolution.fBaseMatrix)->super_TPZSavable)._vptr_TPZSavable[0xf])();
  }
  SetDeltaTime(this,this_00,mat);
  lVar1 = __dynamic_cast(mat,&TPZMaterial::typeinfo,&TPZConservationLaw::typeinfo,0);
  *(undefined8 *)(lVar1 + 0x58) = 0xbff0000000000000;
  std::operator<<((ostream *)&std::cout,
                  "\nTPZNonLinMultGridAnalysis::OneGridAlgorithm Numero de iteracoes ? :\n");
  std::istream::operator>>((istream *)&std::cin,&iter);
  std::operator<<((ostream *)&std::cout,"\nTPZNonLinMultGridAnalysis::OneGridAlgorithm Marcha ? :\n"
                 );
  std::istream::operator>>((istream *)&std::cin,&marcha);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&solout,"OneGridAlgorithm.vtk",&local_6e1);
  SmoothingSolution(this,10.0,iter,mat,&finean,marcha,&solout);
  std::__cxx11::string::~string((string *)&solout);
  TPZStepSolver<double>::~TPZStepSolver(&finesolver);
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>::~TPZSkylineStructMatrix(&finestiff);
  TPZLinearAnalysis::~TPZLinearAnalysis(&finean);
  return;
}

Assistant:

void TPZNonLinMultGridAnalysis::OneGridAlgorithm(std::ostream &out,int nummat){
	//ALGORITMO SIMPLES A UMA MALHA
	int iter,marcha;
	cout << "TPZNonLinMultGridAnalysis::OneGridAlgorithm Name of the out dx OneGridAlgorithm.dx\n";
	int levelnumbertorefine = 1;
	cout << "TPZNonLinMultGridAnalysis:: nmero de n�eis a dividir: ";
	cin >> levelnumbertorefine;
	TPZCompMesh *coarcmesh = fMeshes[0];//malha grosseira inicial
	int setdegree = -1;//preserva o grau da malha inicial
	TPZCompMesh *finemesh = UniformlyRefineMesh(coarcmesh,levelnumbertorefine,setdegree);
	TPZMaterial * finemat = finemesh->FindMaterial(nummat);
	int meshdim = coarcmesh->Dimension();
	finemesh->SetDimModel(meshdim);
	finemesh->SetName("\n\t\t\t* * * MALHA COMPUTACIONAL FINA * * *\n\n");
	finemesh->Reference()->ResetReference();
	finemesh->LoadReferences();
	TPZLinearAnalysis finean(finemesh);
	TPZSkylineStructMatrix<STATE> finestiff(finemesh);
	finean.SetStructuralMatrix(finestiff);
	TPZStepSolver<STATE> finesolver;
	finesolver.SetDirect(ELDLt);
	finean.SetSolver(finesolver);
	finean.Solution().Zero();
	SetDeltaTime(finemesh,finemat);//para calcular o passo e estimar o nmero de iterac�s
	TPZConservationLaw *law = dynamic_cast<TPZConservationLaw *>(finemat);
	law->SetTimeStep(-1);//para obter o c�culo antes da primeira soluc�
	cout << "\nTPZNonLinMultGridAnalysis::OneGridAlgorithm Numero de iteracoes ? :\n";
	cin >> iter;
	cout << "\nTPZNonLinMultGridAnalysis::OneGridAlgorithm Marcha ? :\n";
	cin >> marcha;
	REAL sol_tol = 1.e1;//valor m�imo da ||solu�o||
	std::string solout("OneGridAlgorithm.vtk");
//	std::string solout("OneGridAlgorithm.dx");
	SmoothingSolution(sol_tol,iter,finemat,finean,marcha,solout);
}